

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# construct2.cpp
# Opt level: O2

int main(void)

{
  undefined4 uVar1;
  allocator_type local_f9;
  vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_> boundary;
  span_t span;
  unitcell unitcell;
  basis basis;
  graph lat;
  basis_t bs;
  
  uVar1 = 1;
  unitcell.dim_ = CONCAT44(unitcell.dim_._4_4_,1);
  lat.dim_._0_4_ = uVar1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&bs,(int *)&lat,(int *)&unitcell);
  *bs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = 1.0;
  lattice::basis::basis(&basis,&bs);
  unitcell.dim_ = 1;
  unitcell.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  unitcell.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  unitcell.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unitcell.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  unitcell.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  unitcell.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lattice::coordinate((lattice *)&lat,0.0);
  lattice::unitcell::add_site(&unitcell,(coordinate_t *)&lat,0);
  free((void *)CONCAT44(lat.dim_._4_4_,(undefined4)lat.dim_));
  lattice::offset((lattice *)&lat,1);
  lattice::unitcell::add_bond(&unitcell,0,0,(offset_t *)&lat,0);
  free((void *)CONCAT44(lat.dim_._4_4_,(undefined4)lat.dim_));
  boundary.super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = uVar1;
  lat.dim_._0_4_ = uVar1;
  Eigen::Matrix<long,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<long,_1,_1,0,_1,_1> *)&span,(int *)&lat,(int *)&boundary);
  *span.super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.m_data = 0x10;
  lat.dim_._0_4_ = 1;
  std::vector<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>::vector
            (&boundary,1,(value_type *)&lat,&local_f9);
  lattice::graph::graph(&lat,&basis,&unitcell,&span,&boundary);
  lattice::graph::print(&lat,(ostream *)&std::cout);
  lattice::graph::~graph(&lat);
  std::_Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>::~_Vector_base
            (&boundary.super__Vector_base<lattice::boundary_t,_std::allocator<lattice::boundary_t>_>
            );
  free(span.super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  lattice::unitcell::~unitcell(&unitcell);
  free(basis.basis_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  free(bs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return 0;
}

Assistant:

int main() {
  lattice::basis_t bs(1, 1); bs << 1; // 1x1 matrix
  lattice::basis basis(bs);
  lattice::unitcell unitcell(1);
  unitcell.add_site(lattice::coordinate(0), 0);
  unitcell.add_bond(0, 0, lattice::offset(1), 0);
  lattice::span_t span(1, 1); span << 16; // 1x1 matrix
  std::vector<lattice::boundary_t> boundary(1, lattice::boundary_t::periodic);
  lattice::graph lat(basis, unitcell, span, boundary);
  lat.print(std::cout);
}